

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O3

CURLcode Curl_ntlm_core_mk_nt_hash(char *password,uchar *ntbuffer)

{
  size_t i;
  size_t sVar1;
  uchar *input;
  size_t sVar2;
  CURLcode CVar3;
  
  sVar1 = strlen(password);
  CVar3 = CURLE_OUT_OF_MEMORY;
  if (-1 < (long)sVar1) {
    if (sVar1 == 0) {
      input = (uchar *)(*Curl_cstrdup)("");
      if (input == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      input = (uchar *)(*Curl_cmalloc)(sVar1 * 2);
      if (input == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      sVar2 = 0;
      do {
        input[sVar2 * 2] = password[sVar2];
        input[sVar2 * 2 + 1] = '\0';
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
    }
    Curl_md4it(ntbuffer,input,sVar1 * 2);
    ntbuffer[0x14] = '\0';
    ntbuffer[0x10] = '\0';
    ntbuffer[0x11] = '\0';
    ntbuffer[0x12] = '\0';
    ntbuffer[0x13] = '\0';
    (*Curl_cfree)(input);
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_ntlm_core_mk_nt_hash(const char *password,
                                   unsigned char *ntbuffer /* 21 bytes */)
{
  size_t len = strlen(password);
  unsigned char *pw;
  if(len > SIZE_T_MAX/2) /* avoid integer overflow */
    return CURLE_OUT_OF_MEMORY;
  pw = len ? malloc(len * 2) : (unsigned char *)strdup("");
  if(!pw)
    return CURLE_OUT_OF_MEMORY;

  ascii_to_unicode_le(pw, password, len);

  /* Create NT hashed password. */
  Curl_md4it(ntbuffer, pw, 2 * len);
  memset(ntbuffer + 16, 0, 21 - 16);

  free(pw);

  return CURLE_OK;
}